

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O1

int __thiscall r_memory_map::_get_posix_prot_flags(r_memory_map *this,int prot)

{
  return prot & 7;
}

Assistant:

int r_memory_map::_get_posix_prot_flags(int prot) const
{
    int osProtFlags = 0;

    if(prot & MM_PROT_READ)
        osProtFlags |= PROT_READ;
    if(prot & MM_PROT_WRITE)
        osProtFlags |= PROT_WRITE;
    if(prot & MM_PROT_EXEC)
        osProtFlags |= PROT_EXEC;

    return osProtFlags;
}